

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-test.h
# Opt level: O2

Struct * __thiscall
TypeTest::makeStruct
          (Struct *__return_storage_ptr__,TypeTest *this,TypeBuilder *builder,
          initializer_list<unsigned_long> indices)

{
  HeapType HVar1;
  long lVar2;
  undefined1 auStack_68 [8];
  FieldList fields;
  Type ref;
  
  auStack_68 = (undefined1  [8])0x0;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar2 = 0; indices._M_len << 3 != lVar2; lVar2 = lVar2 + 8) {
    ref.id = (uintptr_t)builder;
    HVar1 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&ref);
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::wasm::TypeBuilder::getTempRefType((HeapType)builder,(Nullability)HVar1.id,Exact)
    ;
    ref.id._0_4_ = 1;
    std::vector<wasm::Field,std::allocator<wasm::Field>>::emplace_back<wasm::Type&,wasm::Mutability>
              ((vector<wasm::Field,std::allocator<wasm::Field>> *)auStack_68,
               (Type *)&fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,(Mutability *)&ref);
  }
  (__return_storage_ptr__->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_68;
  (__return_storage_ptr__->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])0x0;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

wasm::Struct makeStruct(wasm::TypeBuilder& builder,
                          std::initializer_list<size_t> indices) {
    using namespace wasm;
    FieldList fields;
    for (auto index : indices) {
      Type ref = builder.getTempRefType(builder[index], Nullable);
      fields.emplace_back(ref, Mutable);
    }
    return Struct(std::move(fields));
  }